

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_graph.cpp
# Opt level: O0

void __thiscall
Clasp::Asp::PrgDepGraph::addNonHcf
          (PrgDepGraph *this,uint32 id,SharedContext *ctx,Configuration *config,uint32 scc)

{
  bool bVar1;
  uint32 uVar2;
  size_type sVar3;
  size_type sVar4;
  AtomNode *pAVar5;
  reference this_00;
  NonHcfComponent *pNVar6;
  PrgDepGraph *this_01;
  reference this_02;
  NonHcfStats *this_03;
  pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
  *in_RDI;
  uint in_R8D;
  uint32 i_2;
  BodyNode *B;
  NodeId *bodyEnd;
  NodeId *bodyIt;
  AtomNode *a;
  uint32 i_1;
  Solver *generator;
  uint32 i;
  VarVec sccBodies;
  VarVec sccAtoms;
  undefined8 in_stack_fffffffffffffeb8;
  PrgDepGraph *in_stack_fffffffffffffec0;
  NonHcfComponent **in_stack_fffffffffffffec8;
  pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent_*,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent_*>_>
  *in_stack_fffffffffffffed0;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee0;
  reference in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  size_type sVar7;
  undefined4 in_stack_ffffffffffffff0c;
  PrgDepGraph *in_stack_ffffffffffffff10;
  NonHcfComponent *in_stack_ffffffffffffff18;
  uint32 id_00;
  NonHcfComponent *in_stack_ffffffffffffff20;
  VarVec *in_stack_ffffffffffffff30;
  size_type sVar8;
  size_type local_8c;
  NonHcfComponent *local_78;
  size_type local_64;
  size_type local_58;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  pod_vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  uint local_24;
  
  local_24 = in_R8D;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            (in_stack_fffffffffffffee0);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            (in_stack_fffffffffffffee0);
  local_58 = 0;
  while( true ) {
    uVar2 = numAtoms((PrgDepGraph *)0x15c480);
    if (local_58 == uVar2) break;
    pAVar5 = getAtom(in_stack_fffffffffffffec0,(NodeId)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if ((*(uint *)&(pAVar5->super_Node).field_0x4 & 0xfffffff) == local_24) {
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffed0,(uint *)in_stack_fffffffffffffec8);
      this_00 = bk_lib::
                pod_vector<Clasp::Asp::PrgDepGraph::AtomNode,_std::allocator<Clasp::Asp::PrgDepGraph::AtomNode>_>
                ::operator[](in_RDI,local_58);
      AtomNode::set(this_00,property_in_non_hcf);
    }
    local_58 = local_58 + 1;
  }
  SharedContext::master((SharedContext *)0x15c578);
  local_64 = 0;
  while( true ) {
    sVar8 = local_64;
    sVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_38);
    if (sVar8 == sVar3) break;
    in_stack_ffffffffffffff30 =
         (VarVec *)
         bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   (&local_38,local_64);
    pAVar5 = getAtom(in_stack_fffffffffffffec0,(NodeId)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    local_78 = (NonHcfComponent *)AtomNode::bodies_begin(pAVar5);
    in_stack_ffffffffffffff20 = local_78;
    pNVar6 = (NonHcfComponent *)AtomNode::bodies_end(pAVar5);
    in_stack_ffffffffffffff18 = pNVar6;
    for (; local_78 != pNVar6; local_78 = (NonHcfComponent *)((long)&local_78->dep_ + 4)) {
      this_01 = (PrgDepGraph *)
                bk_lib::
                pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                ::operator[]((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                              *)(in_RDI + 1),*(size_type *)&local_78->dep_);
      in_stack_ffffffffffffff10 = this_01;
      bVar1 = BodyNode::seen((BodyNode *)this_01);
      in_stack_ffffffffffffff0c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff0c);
      if (!bVar1) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffffed0,(uint *)in_stack_fffffffffffffec8);
        BodyNode::seen((BodyNode *)this_01,true);
      }
    }
    local_64 = local_64 + 1;
  }
  local_8c = 0;
  while( true ) {
    uVar2 = (uint32)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    sVar7 = local_8c;
    sVar4 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_48);
    id_00 = (uint32)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (sVar7 == sVar4) break;
    in_stack_fffffffffffffef8 =
         bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   (&local_48,local_8c);
    this_02 = bk_lib::
              pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
              ::operator[]((pod_vector<Clasp::Asp::PrgDepGraph::BodyNode,_std::allocator<Clasp::Asp::PrgDepGraph::BodyNode>_>
                            *)(in_RDI + 1),*in_stack_fffffffffffffef8);
    BodyNode::seen(this_02,false);
    local_8c = local_8c + 1;
  }
  operator_new(0x20);
  NonHcfComponent::NonHcfComponent
            (in_stack_ffffffffffffff20,id_00,in_stack_ffffffffffffff10,
             (SharedContext *)CONCAT44(in_stack_ffffffffffffff0c,sVar4),
             (Configuration *)CONCAT44(sVar7,in_stack_ffffffffffffff00),uVar2,
             in_stack_ffffffffffffff30,(VarVec *)CONCAT44(sVar3,sVar8));
  bk_lib::
  pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent_*,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent_*>_>
  ::push_back(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (in_RDI[3].ebo_.buf != (pointer)0x0) {
    pNVar6 = (NonHcfComponent *)in_RDI[3].ebo_.buf;
    this_03 = (NonHcfStats *)
              bk_lib::
              pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent_*,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent_*>_>
              ::back((pod_vector<Clasp::Asp::PrgDepGraph::NonHcfComponent_*,_std::allocator<Clasp::Asp::PrgDepGraph::NonHcfComponent_*>_>
                      *)(in_RDI + 2));
    NonHcfStats::addHcc(this_03,pNVar6);
  }
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::~pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15c8c0);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::~pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x15c8cd);
  return;
}

Assistant:

void PrgDepGraph::addNonHcf(uint32 id, SharedContext& ctx, Configuration* config, uint32 scc) {
	VarVec sccAtoms, sccBodies;
	// get all atoms from scc
	for (uint32 i = 0; i != numAtoms(); ++i) {
		if (getAtom(i).scc == scc) {
			sccAtoms.push_back(i);
			atoms_[i].set(AtomNode::property_in_non_hcf);
		}
	}
	// get all bodies defining an atom in scc
	const Solver& generator = *ctx.master(); (void)generator;
	for (uint32 i = 0; i != sccAtoms.size(); ++i) {
		const AtomNode& a = getAtom(sccAtoms[i]);
		for (const NodeId* bodyIt = a.bodies_begin(), *bodyEnd = a.bodies_end(); bodyIt != bodyEnd; ++bodyIt) {
			BodyNode& B = bodies_[*bodyIt];
			if (!B.seen()) {
				assert(generator.value(B.lit.var()) != value_free || !generator.seen(B.lit));
				sccBodies.push_back(*bodyIt);
				B.seen(true);
			}
		}
	}
	for (uint32 i = 0; i != sccBodies.size(); ++i) { bodies_[sccBodies[i]].seen(false); }
	components_.push_back( new NonHcfComponent(id, *this, ctx, config, scc, sccAtoms, sccBodies) );
	if (stats_) { stats_->addHcc(*components_.back()); }
}